

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::ReserveCVCapacity(ON_NurbsCage *this,int capacity)

{
  double *pdVar1;
  
  if (0 < capacity) {
    if (this->m_cv_capacity < capacity) {
      if (this->m_cv == (double *)0x0) {
        pdVar1 = (double *)onmalloc((ulong)(uint)capacity << 3);
      }
      else {
        if (this->m_cv_capacity == 0) goto LAB_0055ebdb;
        pdVar1 = (double *)onrealloc(this->m_cv,(ulong)(uint)capacity << 3);
      }
      this->m_cv = pdVar1;
      if (pdVar1 == (double *)0x0) {
        capacity = 0;
      }
      this->m_cv_capacity = capacity;
    }
  }
LAB_0055ebdb:
  return this->m_cv != (double *)0x0;
}

Assistant:

bool ON_NurbsCage::ReserveCVCapacity(
  int capacity// number of doubles to reserve
  )
{
  if ( capacity > 0 && m_cv_capacity < capacity ) 
  {
    if ( m_cv ) 
    {
      if ( m_cv_capacity ) 
      {
        m_cv = (double*)onrealloc( m_cv, capacity*sizeof(*m_cv) );
        m_cv_capacity = (m_cv) ? capacity : 0;
      }
      // else user supplied m_cv[] array
    }
    else 
    {
      m_cv = (double*)onmalloc( capacity*sizeof(*m_cv) );
      m_cv_capacity = (m_cv) ? capacity : 0;
    }
  }
  return ( m_cv ) ? true : false;
}